

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandLineArgument.h
# Opt level: O1

void __thiscall
cmCommandLineArgument<bool(std::__cxx11::string_const&,cmake*,cmMakefile*)>::
cmCommandLineArgument<std::function<bool(std::__cxx11::string_const&,cmake*,cmMakefile*)>>
          (cmCommandLineArgument<bool(std::__cxx11::string_const&,cmake*,cmMakefile*)> *this,
          string *n,Values t,
          function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*,_cmMakefile_*)>
          *func)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  size_type local_38;
  pointer local_30;
  
  local_30 = (n->_M_dataplus)._M_p;
  local_38 = n->_M_string_length;
  local_48._M_len = 0x17;
  local_48._M_str = " is invalid syntax for ";
  views._M_len = 2;
  views._M_array = &local_48;
  cmCatViews_abi_cxx11_((string *)this,views);
  local_30 = (n->_M_dataplus)._M_p;
  local_38 = n->_M_string_length;
  local_48._M_len = 0x18;
  local_48._M_str = "Invalid value used with ";
  views_00._M_len = 2;
  views_00._M_array = &local_48;
  cmCatViews_abi_cxx11_((string *)(this + 0x20),views_00);
  *(cmCommandLineArgument<bool(std::__cxx11::string_const&,cmake*,cmMakefile*)> **)(this + 0x40) =
       this + 0x50;
  pcVar2 = (n->_M_dataplus)._M_p;
  paVar1 = &n->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&n->field_2 + 8);
    *(size_type *)(this + 0x50) = paVar1->_M_allocated_capacity;
    *(undefined8 *)(this + 0x58) = uVar3;
  }
  else {
    *(pointer *)(this + 0x40) = pcVar2;
    *(size_type *)(this + 0x50) = paVar1->_M_allocated_capacity;
  }
  *(size_type *)(this + 0x48) = n->_M_string_length;
  (n->_M_dataplus)._M_p = (pointer)paVar1;
  n->_M_string_length = 0;
  (n->field_2)._M_local_buf[0] = '\0';
  *(Values *)(this + 0x60) = t;
  *(undefined8 *)(this + 100) = 0;
  *(undefined8 *)(this + 0x6c) = 0;
  *(undefined8 *)(this + 0x70) = 0;
  *(undefined8 *)(this + 0x78) = 0;
  *(_Invoker_type *)(this + 0x80) = func->_M_invoker;
  if ((func->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar3 = *(undefined8 *)((long)&(func->super__Function_base)._M_functor + 8);
    *(undefined8 *)(this + 0x68) = *(undefined8 *)&(func->super__Function_base)._M_functor;
    *(undefined8 *)(this + 0x70) = uVar3;
    *(_Manager_type *)(this + 0x78) = (func->super__Function_base)._M_manager;
    (func->super__Function_base)._M_manager = (_Manager_type)0x0;
    func->_M_invoker = (_Invoker_type)0x0;
  }
  return;
}

Assistant:

cmCommandLineArgument(std::string n, Values t, FunctionType&& func)
    : InvalidSyntaxMessage(cmStrCat(" is invalid syntax for ", n))
    , InvalidValueMessage(cmStrCat("Invalid value used with ", n))
    , Name(std::move(n))
    , Type(t)
    , SeparatorNeeded(RequiresSeparator::Yes)
    , StoreCall(std::forward<FunctionType>(func))
  {
  }